

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O2

int beMsgGetListBdIds(be_node *n,list<bdId,_std::allocator<bdId>_> *nodes)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bdId id;
  
  if (n->type != BE_STR) {
    return 0;
  }
  uVar2 = be_str_len(n);
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 0x1a;
  uVar4 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x1a - uVar4 != 0; uVar4 = uVar4 + 0x1a) {
    bdId::bdId(&id);
    iVar1 = decodeCompactNodeId(&id,(n->val).s + uVar4,0x1a);
    if (iVar1 != 0) {
      std::__cxx11::list<bdId,_std::allocator<bdId>_>::push_back(nodes,&id);
    }
  }
  return 1;
}

Assistant:

int beMsgGetListBdIds(be_node *n, std::list<bdId> &nodes) {
	/* extract the string pointer, and size */
	/* split into parts */

        if (n->type != BE_STR)
            return 0;

	int len = be_str_len(n);
	int count = len / BITDHT_COMPACTNODEID_LEN;
	for (int i = 0; i < count; i++) {
		bdId id;
		if (decodeCompactNodeId(&id, &(n->val.s[i*BITDHT_COMPACTNODEID_LEN]), BITDHT_COMPACTNODEID_LEN))
			nodes.push_back(id);
	}
    return 1;
}